

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O1

void scheduler_fiber_proc_for_user_worker(cilk_fiber *fiber)

{
  __cilkrts_worker *w;
  
  w = (fiber->super_cilk_fiber_data).owner;
  if (w == (__cilkrts_worker *)0x0) {
    scheduler_fiber_proc_for_user_worker_cold_2();
  }
  else if (w->l->type == WORKER_USER) {
    __cilkrts_run_scheduler_with_exceptions(w);
    return;
  }
  scheduler_fiber_proc_for_user_worker_cold_1();
}

Assistant:

COMMON_PORTABLE
void scheduler_fiber_proc_for_user_worker(cilk_fiber *fiber)
{
    __cilkrts_worker* w = cilk_fiber_get_owner(fiber);
    CILK_ASSERT(w);

    // This must be a user worker
    CILK_ASSERT(WORKER_USER == w->l->type);

    // If we aren't the current worker, then something is very wrong
    // here..
    verify_current_wkr(w);

    __cilkrts_run_scheduler_with_exceptions(w);
}